

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_ml_literal_string<toml::type_config>
          (result<toml::basic_value<toml::type_config>,_toml::error_info> *__return_storage_ptr__,
          location *loc,context<toml::type_config> *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  reference pvVar2;
  basic_value<toml::type_config> *v;
  string_format_info fmt;
  string *this;
  size_type sStack_440;
  allocator<char> local_429;
  string str;
  string_type val;
  string_type local_3e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3c8;
  string local_3b0;
  string local_390;
  region reg;
  location local_308;
  undefined1 local_2c0 [200];
  location first;
  region local_1b0;
  basic_value<toml::type_config> local_148;
  error_info local_80;
  
  location::location(&first,loc);
  syntax::ml_literal_string((sequence *)local_2c0,&ctx->toml_spec_);
  sequence::scan(&reg,(sequence *)local_2c0,loc);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *)
          (local_2c0 + 8));
  if (reg.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_390,"toml::parse_ml_literal_string: invalid string format",
               (allocator<char> *)&val);
    syntax::ml_literal_string((sequence *)&str,&ctx->toml_spec_);
    location::location(&local_308,loc);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,"",&local_429);
    make_syntax_error<toml::detail::sequence>
              ((error_info *)local_2c0,&local_390,(sequence *)&str,&local_308,&local_3b0);
    err<toml::error_info>((failure<toml::error_info> *)&local_80,(error_info *)local_2c0);
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (__return_storage_ptr__,(failure_type *)&local_80);
    error_info::~error_info(&local_80);
    error_info::~error_info((error_info *)local_2c0);
    std::__cxx11::string::~string((string *)&local_3b0);
    location::~location(&local_308);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *
            )&str._M_string_length);
    this = &local_390;
    goto LAB_003239ec;
  }
  region::as_string_abi_cxx11_(&str,&reg);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,0,3);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,
             str._M_string_length - 3,3);
  fmt.fmt = multiline_literal;
  fmt.start_with_newline = false;
  if (str._M_string_length != 0) {
    pvVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                       (&str,0);
    if (*pvVar2 == '\n') {
      sStack_440 = 1;
LAB_003237ab:
      fmt.fmt = multiline_literal;
      fmt.start_with_newline = true;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,0,
                 sStack_440);
    }
    else if (1 < str._M_string_length) {
      pvVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                         (&str,0);
      if (*pvVar2 == '\r') {
        pvVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                           (&str,1);
        if (*pvVar2 == '\n') {
          sStack_440 = 2;
          goto LAB_003237ab;
        }
      }
    }
  }
  paVar1 = &val.field_2;
  val._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((string *)&val,str._M_dataplus._M_p,str._M_dataplus._M_p + str._M_string_length);
  local_3e8._M_string_length = val._M_string_length;
  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)val._M_dataplus._M_p == paVar1) {
    local_3e8.field_2._8_8_ = val.field_2._8_8_;
  }
  else {
    local_3e8._M_dataplus._M_p = val._M_dataplus._M_p;
  }
  val._M_string_length = 0;
  val.field_2._M_local_buf[0] = '\0';
  local_3c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  val._M_dataplus._M_p = (pointer)paVar1;
  region::region(&local_1b0,&reg);
  basic_value<toml::type_config>::basic_value
            ((basic_value<toml::type_config> *)local_2c0,&local_3e8,fmt,&local_3c8,&local_1b0);
  ok<toml::basic_value<toml::type_config>>
            ((success<toml::basic_value<toml::type_config>_> *)&local_148,(toml *)local_2c0,v);
  result<toml::basic_value<toml::type_config>,_toml::error_info>::result
            (__return_storage_ptr__,(success_type *)&local_148);
  basic_value<toml::type_config>::~basic_value(&local_148);
  basic_value<toml::type_config>::~basic_value((basic_value<toml::type_config> *)local_2c0);
  region::~region(&local_1b0);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&val);
  this = &str;
LAB_003239ec:
  std::__cxx11::string::~string((string *)this);
  region::~region(&reg);
  location::~location(&first);
  return __return_storage_ptr__;
}

Assistant:

result<basic_value<TC>, error_info>
parse_ml_literal_string(location& loc, const context<TC>& ctx)
{
    const auto first = loc;
    const auto& spec = ctx.toml_spec();

    string_format_info fmt;
    fmt.fmt = string_format::multiline_literal;

    auto reg = syntax::ml_literal_string(spec).scan(loc);
    if( ! reg.is_ok())
    {
        return err(make_syntax_error("toml::parse_ml_literal_string: "
            "invalid string format",
            syntax::ml_literal_string(spec), loc));
    }

    // ----------------------------------------------------------------------
    // it matches. gen value

    auto str = reg.as_string();

    assert(str.substr(0, 3) == "'''");
    assert(str.substr(str.size()-3, 3) == "'''");
    str.erase(0, 3);
    str.erase(str.size()-3, 3);

    // the first newline just after """ is trimmed
    if(str.size() >= 1 && str.at(0) == '\n')
    {
        str.erase(0, 1);
        fmt.start_with_newline = true;
    }
    else if(str.size() >= 2 && str.at(0) == '\r' && str.at(1) == '\n')
    {
        str.erase(0, 2);
        fmt.start_with_newline = true;
    }

    using string_type = typename basic_value<TC>::string_type;
    string_type val(str.begin(), str.end());

    return ok(basic_value<TC>(
            std::move(val), std::move(fmt), {}, std::move(reg)
        ));
}